

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

int __thiscall FIX::ScreenLogFactory::init(ScreenLogFactory *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  bool bVar2;
  undefined8 uVar3;
  bool *in_RCX;
  bool *in_RDX;
  byte *in_R8;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  byte *local_30;
  bool *event_local;
  bool *outgoing_local;
  bool *incoming_local;
  Dictionary *settings_local;
  ScreenLogFactory *this_local;
  
  if ((this->m_useSettings & 1U) == 0) {
    *in_RDX = (bool)(this->m_incoming & 1);
    *in_RCX = (bool)(this->m_outgoing & 1);
    *in_R8 = this->m_event & 1;
  }
  else {
    *in_RDX = true;
    *in_RCX = true;
    *in_R8 = 1;
    local_30 = in_R8;
    event_local = in_RCX;
    outgoing_local = in_RDX;
    incoming_local = (bool *)ctx;
    settings_local = (Dictionary *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ScreenLogShowIncoming",&local_51);
    bVar2 = Dictionary::has((Dictionary *)ctx,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pbVar1 = incoming_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"ScreenLogShowIncoming",&local_89);
      bVar2 = Dictionary::getBool((Dictionary *)pbVar1,&local_88);
      *outgoing_local = bVar2;
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
    pbVar1 = incoming_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"ScreenLogShowOutgoing",&local_b1);
    bVar2 = Dictionary::has((Dictionary *)pbVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pbVar1 = incoming_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"ScreenLogShowOutgoing",&local_d9);
      bVar2 = Dictionary::getBool((Dictionary *)pbVar1,&local_d8);
      *event_local = bVar2;
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    pbVar1 = incoming_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"ScreenLogShowEvents",&local_101);
    bVar2 = Dictionary::has((Dictionary *)pbVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    uVar3 = std::allocator<char>::~allocator(&local_101);
    pbVar1 = incoming_local;
    in_R8 = (byte *)CONCAT71((int7)((ulong)uVar3 >> 8),bVar2);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"ScreenLogShowEvents",&local_129);
      bVar2 = Dictionary::getBool((Dictionary *)pbVar1,&local_128);
      *local_30 = bVar2;
      std::__cxx11::string::~string((string *)&local_128);
      in_R8 = (byte *)std::allocator<char>::~allocator(&local_129);
    }
  }
  return (int)in_R8;
}

Assistant:

void ScreenLogFactory::init( const Dictionary& settings, bool& incoming, bool& outgoing, bool& event )
{  
  if( m_useSettings )
  {
    incoming = true;
    outgoing = true;
    event = true;

    if( settings.has(SCREEN_LOG_SHOW_INCOMING) )
      incoming = settings.getBool(SCREEN_LOG_SHOW_INCOMING);
    if( settings.has(SCREEN_LOG_SHOW_OUTGOING) )
      outgoing = settings.getBool(SCREEN_LOG_SHOW_OUTGOING);
    if( settings.has(SCREEN_LOG_SHOW_EVENTS) )
      event = settings.getBool(SCREEN_LOG_SHOW_EVENTS);
  }
  else
  {
    incoming = m_incoming;
    outgoing = m_outgoing;
    event = m_event;
  }
}